

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

bool slang::ast::isValidAssignLVal(Expression *expr)

{
  Symbol *pSVar1;
  ConcatenationExpression *this;
  Expression *in_RDI;
  Expression *op;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  Symbol *sym;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  ExpressionKind EVar2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_38;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_30;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_20;
  Expression *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  EVar2 = in_RDI->kind;
  if (EVar2 - NamedValue < 2) {
    pSVar1 = Expression::getSymbolReference
                       ((Expression *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                        SUB81((ulong)in_RDI >> 0x38,0));
    if ((pSVar1 == (Symbol *)0x0) || (bVar3 = VariableSymbol::isKind(pSVar1->kind), bVar3)) {
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  else if (EVar2 == Concatenation) {
    this = Expression::as<slang::ast::ConcatenationExpression>(in_RDI);
    local_30 = ConcatenationExpression::operands(this);
    local_20 = &local_30;
    local_38._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   (in_stack_ffffffffffffffa8);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
              (in_stack_ffffffffffffffb8);
    while (bVar3 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)CONCAT44(EVar2,in_stack_ffffffffffffffb0),
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffa8), ((bVar3 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator*(&local_38);
      bVar3 = isValidAssignLVal(in_stack_ffffffffffffffe8);
      if (!bVar3) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_38);
    }
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool isValidAssignLVal(const Expression& expr) {
    switch (expr.kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            if (auto sym = expr.getSymbolReference()) {
                if (!VariableSymbol::isKind(sym->kind))
                    return false;
            }
            return true;
        case ExpressionKind::Concatenation:
            for (auto op : expr.as<ConcatenationExpression>().operands()) {
                if (!isValidAssignLVal(*op))
                    return false;
            }
            return true;
        default:
            return false;
    }
}